

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRPathRemoveCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  bool removed;
  cmCommand *local_218;
  cmFileTimes ft;
  string emsg;
  string file;
  string local_1c8;
  ostringstream e;
  
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  bVar4 = false;
  uVar6 = 1;
  local_218 = &this->super_cmCommand;
  for (; pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar6 = (ulong)((int)uVar6 + 1)) {
    bVar3 = std::operator==(pbVar1 + uVar6,"FILE");
    bVar2 = true;
    if (!bVar3) {
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"RPATH_REMOVE given unknown argument ");
        std::operator<<(poVar5,(string *)
                               ((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar6));
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_218,&emsg);
        goto LAB_0017e154;
      }
      std::__cxx11::string::_M_assign((string *)&file);
      bVar2 = false;
    }
    bVar4 = bVar2;
  }
  if (file._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"RPATH_REMOVE not given FILE option.",(allocator<char> *)&emsg);
    cmCommand::SetError(local_218,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    bVar4 = cmsys::SystemTools::FileExists(&file,true);
    if (bVar4) {
      cmFileTimes::cmFileTimes(&ft,&file);
      emsg._M_dataplus._M_p = (pointer)&emsg.field_2;
      emsg._M_string_length = 0;
      emsg.field_2._M_local_buf[0] = '\0';
      bVar4 = cmSystemTools::RemoveRPath(&file,&emsg,&removed);
      if (bVar4) {
        if (removed == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"Removed runtime path from \"",(allocator<char> *)&local_1c8);
          std::__cxx11::string::append((string *)&e);
          std::__cxx11::string::append((char *)&e);
          cmMakefile::DisplayStatus(local_218->Makefile,(string *)&e,-1.0);
          std::__cxx11::string::~string((string *)&e);
        }
        cmFileTimes::Store(&ft,&file);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"RPATH_REMOVE could not remove RPATH from file:\n");
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,(string *)&file);
        poVar5 = std::operator<<(poVar5,"\n");
        std::operator<<(poVar5,(string *)&emsg);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_218,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      std::__cxx11::string::~string((string *)&emsg);
      cmFileTimes::~cmFileTimes(&ft);
      goto LAB_0017e16d;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,"RPATH_REMOVE given FILE \"");
    poVar5 = std::operator<<(poVar5,(string *)&file);
    std::operator<<(poVar5,"\" that does not exist.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(local_218,&emsg);
LAB_0017e154:
    std::__cxx11::string::~string((string *)&emsg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  bVar4 = false;
LAB_0017e16d:
  std::__cxx11::string::~string((string *)&file);
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleWriteCommand(std::vector<std::string> const& args,
                                       bool append)
{
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + *i;
  }

  i++;

  if (!this->Makefile->CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error = "failed to open for writing (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error = "write failed (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}